

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_multipleModelResolution_Test::~Importer_multipleModelResolution_Test
          (Importer_multipleModelResolution_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, multipleModelResolution)
{
    // This test is intended to show how the Importer class can hold multiple imported models in its library, and that
    // these can be used to resolve the imports of more than one importing model.
    // The example given has two models A, B, each importing the same four components, a, b, c, d from a
    // third model D. We expect that model D is parsed and instantiated just once, rather than 8 times.

    auto parser = libcellml::Parser::create();
    auto modelA = parser->parseModel(fileContents("importer/generic.cellml"));
    auto modelB = parser->parseModel(fileContents("importer/generic.cellml"));

    // Model D will be imported into the library as it's included as a dependency in the models here.
    // Passing in one of the models for resolution will load model D into the library.
    auto importer = libcellml::Importer::create();
    importer->resolveImports(modelA, resourcePath("importer/"));

    EXPECT_EQ(size_t(1), importer->libraryCount());

    // Now resolve the other models and expect the library contents to be unchanged.
    importer->resolveImports(modelB, resourcePath("importer/"));

    EXPECT_EQ(size_t(1), importer->libraryCount());
}